

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodeSetPtr xmlXPathNodeLeadingSorted(xmlNodeSetPtr nodes,xmlNodePtr node)

{
  int iVar1;
  xmlNodeSetPtr cur;
  xmlNodePtr val;
  ulong uVar2;
  xmlNodeSetPtr pxVar3;
  ulong uVar4;
  
  pxVar3 = nodes;
  if (node != (xmlNodePtr)0x0) {
    cur = xmlXPathNodeSetCreate((xmlNodePtr)0x0);
    pxVar3 = (xmlNodeSetPtr)0x0;
    if ((((cur != (xmlNodeSetPtr)0x0) && (pxVar3 = cur, nodes != (xmlNodeSetPtr)0x0)) &&
        (nodes->nodeNr != 0)) &&
       ((nodes->nodeTab != (xmlNodePtr *)0x0 &&
        (iVar1 = xmlXPathNodeSetContains(nodes,node), iVar1 != 0)))) {
      uVar4 = 0;
      uVar2 = (ulong)(uint)nodes->nodeNr;
      if (nodes->nodeNr < 1) {
        uVar2 = uVar4;
      }
      do {
        if (uVar2 == uVar4) {
          return cur;
        }
        if ((long)uVar4 < (long)nodes->nodeNr) {
          val = nodes->nodeTab[uVar4];
        }
        else {
          val = (xmlNodePtr)0x0;
        }
        if (val == node) {
          return cur;
        }
        iVar1 = xmlXPathNodeSetAddUnique(cur,val);
        uVar4 = uVar4 + 1;
      } while (-1 < iVar1);
    }
  }
  return pxVar3;
}

Assistant:

xmlNodeSetPtr
xmlXPathNodeLeadingSorted (xmlNodeSetPtr nodes, xmlNodePtr node) {
    int i, l;
    xmlNodePtr cur;
    xmlNodeSetPtr ret;

    if (node == NULL)
	return(nodes);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);
    if (xmlXPathNodeSetIsEmpty(nodes) ||
	(!xmlXPathNodeSetContains(nodes, node)))
	return(ret);

    l = xmlXPathNodeSetGetLength(nodes);
    for (i = 0; i < l; i++) {
	cur = xmlXPathNodeSetItem(nodes, i);
	if (cur == node)
	    break;
        /* TODO: Propagate memory error. */
	if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	    break;
    }
    return(ret);
}